

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::EventDelayStmt::EventDelayStmt(EventDelayStmt *this,EventControl event)

{
  AuxiliaryStmt::AuxiliaryStmt(&this->super_AuxiliaryStmt,Delay);
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002a7630;
  (this->event_).delay = event.delay;
  (this->event_).var = event.var;
  (this->event_).type = event.type;
  (this->event_).edge = event.edge;
  (this->event_).delay_side = event.delay_side;
  *(undefined4 *)&(this->event_).field_0x1c = event._28_4_;
  return;
}

Assistant:

EventDelayStmt::EventDelayStmt(kratos::EventControl event)
    : AuxiliaryStmt(AuxiliaryType::Delay), event_(event) {}